

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_tzx.cpp
# Opt level: O0

void TZX_AppendStandardBlock(path *fname,byte *buf,aint buflen,word pauseAfterMs,byte sync)

{
  uint uVar1;
  char *badValueMessage;
  int local_60;
  byte local_59;
  aint i;
  byte check;
  aint totalDataLen;
  string local_48;
  FILE *local_28;
  FILE *ff;
  byte sync_local;
  word pauseAfterMs_local;
  byte *pbStack_18;
  aint buflen_local;
  byte *buf_local;
  path *fname_local;
  
  ff._1_1_ = sync;
  ff._2_2_ = pauseAfterMs;
  ff._4_4_ = buflen;
  pbStack_18 = buf;
  buf_local = (byte *)fname;
  local_28 = (FILE *)SJ_fopen(fname,"a+b");
  if (local_28 == (FILE *)0x0) {
    std::filesystem::__cxx11::path::string(&local_48,(path *)buf_local);
    badValueMessage = (char *)std::__cxx11::string::c_str();
    Error("[TZX] Error opening file for append",badValueMessage,FATAL);
    std::__cxx11::string::~string((string *)&local_48);
  }
  uVar1 = ff._4_4_ + 2;
  fputc(0x10,local_28);
  fputc(ff._2_2_ & 0xff,local_28);
  fputc((int)(uint)ff._2_2_ >> 8,local_28);
  fputc(uVar1 & 0xff,local_28);
  fputc((int)uVar1 >> 8,local_28);
  fputc((uint)ff._1_1_,local_28);
  fwrite(pbStack_18,1,(long)ff._4_4_,local_28);
  local_59 = ff._1_1_;
  for (local_60 = 0; local_60 < ff._4_4_; local_60 = local_60 + 1) {
    local_59 = local_59 ^ pbStack_18[local_60];
  }
  fputc((uint)local_59,local_28);
  fclose(local_28);
  return;
}

Assistant:

void TZX_AppendStandardBlock(const std::filesystem::path & fname,
							 const byte* buf, const aint buflen, word pauseAfterMs, byte sync) {
	FILE* ff;
	if (!FOPEN_ISOK(ff, fname, "a+b")) {
		Error("[TZX] Error opening file for append", fname.string().c_str(), FATAL);
	}

	const aint totalDataLen = buflen + 2; // + sync byte + checksum

	fputc(TZXBlockId::Standard, ff); // block id

	fputc(pauseAfterMs & 0xFF, ff); // block header
	fputc(pauseAfterMs >> 8, ff);
	fputc(totalDataLen & 0xFF, ff);
	fputc(totalDataLen >> 8, ff);

	fputc(sync, ff); // sync pattern
	fwrite(buf, 1, buflen, ff); // payload
	byte check = sync;
	for (aint i = 0; i < buflen; ++i) check ^= buf[i];
	fputc(check, ff); // checksum
	fclose(ff);
}